

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermConstantUnion * __thiscall
glslang::TIntermediate::addConstantUnion
          (TIntermediate *this,unsigned_short u16,TSourceLoc *loc,bool literal)

{
  pointer pTVar1;
  TIntermConstantUnion *pTVar2;
  TIntermediate *this_00;
  TConstUnionArray unionArray;
  TConstUnionArray local_d0;
  
  TConstUnionArray::TConstUnionArray(&local_d0,1);
  pTVar1 = ((local_d0.unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pTVar1->field_0).u16Const = u16;
  pTVar1->type = EbtUint16;
  this_00 = (TIntermediate *)&stack0xffffffffffffff40;
  TType::TType((TType *)&stack0xffffffffffffff40,EbtUint16,EvqConst,1,0,0,false);
  pTVar2 = addConstantUnion(this_00,&local_d0,(TType *)&stack0xffffffffffffff40,loc,literal);
  return pTVar2;
}

Assistant:

TIntermConstantUnion* TIntermediate::addConstantUnion(unsigned short u16, const TSourceLoc& loc, bool literal) const
{
    TConstUnionArray unionArray(1);
    unionArray[0].setU16Const(u16);

    return addConstantUnion(unionArray, TType(EbtUint16, EvqConst), loc, literal);
}